

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallPtrSet.cpp
# Opt level: O1

void __thiscall llvm::SmallPtrSetImplBase::Grow(SmallPtrSetImplBase *this,uint NewSize)

{
  uint uVar1;
  void **ppvVar2;
  void **__ptr;
  void *Ptr;
  void **ppvVar3;
  long lVar4;
  
  ppvVar2 = this->SmallArray;
  __ptr = this->CurArray;
  uVar1 = (&this->CurArraySize)[__ptr == ppvVar2];
  ppvVar3 = (void **)malloc((ulong)NewSize << 3);
  if (ppvVar3 == (void **)0x0) {
    report_bad_alloc_error("Allocation failed",true);
  }
  this->CurArray = ppvVar3;
  this->CurArraySize = NewSize;
  memset(ppvVar3,0xff,(ulong)NewSize << 3);
  if ((ulong)uVar1 != 0) {
    lVar4 = 0;
    do {
      Ptr = *(void **)((long)__ptr + lVar4);
      if (Ptr < (void *)0xfffffffffffffffe) {
        ppvVar3 = FindBucketFor(this,Ptr);
        *ppvVar3 = Ptr;
      }
      lVar4 = lVar4 + 8;
    } while ((ulong)uVar1 << 3 != lVar4);
  }
  if (__ptr != ppvVar2) {
    free(__ptr);
  }
  this->NumNonEmpty = this->NumNonEmpty - this->NumTombstones;
  this->NumTombstones = 0;
  return;
}

Assistant:

void SmallPtrSetImplBase::Grow(unsigned NewSize) {
  const void **OldBuckets = CurArray;
  const void **OldEnd = EndPointer();
  bool WasSmall = isSmall();

  // Install the new array.  Clear all the buckets to empty.
  const void **NewBuckets = (const void**) safe_malloc(sizeof(void*) * NewSize);

  // Reset member only if memory was allocated successfully
  CurArray = NewBuckets;
  CurArraySize = NewSize;
  memset(CurArray, -1, NewSize*sizeof(void*));

  // Copy over all valid entries.
  for (const void **BucketPtr = OldBuckets; BucketPtr != OldEnd; ++BucketPtr) {
    // Copy over the element if it is valid.
    const void *Elt = *BucketPtr;
    if (Elt != getTombstoneMarker() && Elt != getEmptyMarker())
      *const_cast<void**>(FindBucketFor(Elt)) = const_cast<void*>(Elt);
  }

  if (!WasSmall)
    free(OldBuckets);
  NumNonEmpty -= NumTombstones;
  NumTombstones = 0;
}